

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  void *pvVar1;
  char *ssl_peer_key;
  Curl_easy *data;
  int ietf_tls_id;
  Curl_cfilter *cf;
  
  cf = (Curl_cfilter *)SSL_get_ex_data((SSL *)ssl,0);
  if (cf != (Curl_cfilter *)0x0) {
    pvVar1 = cf->ctx;
    ssl_peer_key = *(char **)((long)pvVar1 + 0x20);
    data = *(Curl_easy **)((long)pvVar1 + 0x48);
    ietf_tls_id = SSL_version((SSL *)ssl);
    Curl_ossl_add_session
              (cf,data,ssl_peer_key,ssl_sessionid,ietf_tls_id,*(char **)((long)pvVar1 + 0x60),
               (uchar *)0x0,0);
  }
  return 0;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  struct Curl_cfilter *cf = (struct Curl_cfilter*) SSL_get_app_data(ssl);
  if(cf) {
    struct Curl_easy *data = CF_DATA_CURRENT(cf);
    struct ssl_connect_data *connssl = cf->ctx;
    Curl_ossl_add_session(cf, data, connssl->peer.scache_key, ssl_sessionid,
                          SSL_version(ssl), connssl->negotiated.alpn,
                          NULL, 0);
  }
  return 0;
}